

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::insertAction(QToolBarLayout *this,int index,QAction *action)

{
  ulong uVar1;
  QToolBarItem *t;
  ulong i;
  P _a;
  
  uVar1 = (this->items).d.size;
  t = createItem(this,action);
  if (t != (QToolBarItem *)0x0) {
    i = 0;
    if (0 < index) {
      i = (ulong)(uint)index;
    }
    if (uVar1 < i) {
      i = uVar1;
    }
    QList<QToolBarItem_*>::insert(&this->items,i,t);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QToolBarLayout::insertAction(int index, QAction *action)
{
    index = qMax(0, index);
    index = qMin(items.size(), index);

    QToolBarItem *item = createItem(action);
    if (item) {
        items.insert(index, item);
        invalidate();
    }
}